

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

void __thiscall
ear::PointSourcePannerDownmix::PointSourcePannerDownmix
          (PointSourcePannerDownmix *this,shared_ptr<ear::PointSourcePanner> *psp,MatrixXd *downmix)

{
  (this->super_PointSourcePanner)._vptr_PointSourcePanner = (_func_int **)&PTR_handle_001ebb30;
  std::__shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>,
             &psp->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->_downmix,
             (DenseStorage<double,__1,__1,__1,_0> *)downmix);
  return;
}

Assistant:

PointSourcePannerDownmix::PointSourcePannerDownmix(
      std::shared_ptr<PointSourcePanner> psp, Eigen::MatrixXd downmix)
      : _psp(psp), _downmix(downmix){}